

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctime.c
# Opt level: O2

int main(void)

{
  int iVar1;
  char *pcVar2;
  time_t t;
  
  t = -0x80000000;
  pcVar2 = ctime(&t);
  iVar1 = strcmp(pcVar2,"Fri Dec 13 21:45:52 1901\n");
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/ctime.c, line %d - %s\n"
           ,0x24,"strcmp( ctime( &t ), \"Fri Dec 13 21:45:52 1901\\n\" ) == 0");
  }
  t = 0x7fffffff;
  pcVar2 = ctime(&t);
  iVar1 = strcmp(pcVar2,"Tue Jan 19 04:14:07 2038\n");
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/ctime.c, line %d - %s\n"
           ,0x27,"strcmp( ctime( &t ), \"Tue Jan 19 04:14:07 2038\\n\" ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    /* TODO: System Clock DST */
    time_t t;

    t = -2147483648l;
    TESTCASE( strcmp( ctime( &t ), "Fri Dec 13 21:45:52 1901\n" ) == 0 );

    t = 2147483647l;
    TESTCASE( strcmp( ctime( &t ), "Tue Jan 19 04:14:07 2038\n" ) == 0 );

    return TEST_RESULTS;
}